

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerUnlockDb(Pager *pPager,int eLock)

{
  int local_1c;
  int local_18;
  int rc;
  int eLock_local;
  Pager *pPager_local;
  
  local_18 = 0;
  if (pPager->fd->pMethods != (sqlite3_io_methods *)0x0) {
    if (pPager->noLock == '\0') {
      local_1c = sqlite3OsUnlock(pPager->fd,eLock);
    }
    else {
      local_1c = 0;
    }
    local_18 = local_1c;
    if (pPager->eLock != '\x05') {
      pPager->eLock = (u8)eLock;
    }
  }
  pPager->changeCountDone = pPager->tempFile;
  return local_18;
}

Assistant:

static int pagerUnlockDb(Pager *pPager, int eLock){
  int rc = SQLITE_OK;

  assert( !pPager->exclusiveMode || pPager->eLock==eLock );
  assert( eLock==NO_LOCK || eLock==SHARED_LOCK );
  assert( eLock!=NO_LOCK || pagerUseWal(pPager)==0 );
  if( isOpen(pPager->fd) ){
    assert( pPager->eLock>=eLock );
    rc = pPager->noLock ? SQLITE_OK : sqlite3OsUnlock(pPager->fd, eLock);
    if( pPager->eLock!=UNKNOWN_LOCK ){
      pPager->eLock = (u8)eLock;
    }
    IOTRACE(("UNLOCK %p %d\n", pPager, eLock))
  }
  pPager->changeCountDone = pPager->tempFile; /* ticket fb3b3024ea238d5c */
  return rc;
}